

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string *full_name,void *parent,string *name,Message *proto,
          Symbol symbol)

{
  bool bVar1;
  LogMessage *pLVar2;
  const_iterator cVar3;
  FileDescriptor *pFVar4;
  long *plVar5;
  long lVar6;
  undefined8 *puVar7;
  LogLevel LVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  Symbol symbol_00;
  Symbol symbol_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  undefined1 local_d0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  string *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  pFVar4 = this->file_;
  symbol_00._4_4_ = 0;
  symbol_00.type = symbol.type;
  symbol_00.field_1.descriptor = symbol.field_1.descriptor;
  local_f8 = (string *)proto;
  local_58 = name;
  bVar1 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,symbol_00);
  if (bVar1) {
    if (parent != (void *)0x0) {
      pFVar4 = (FileDescriptor *)parent;
    }
    symbol_01._4_4_ = 0;
    symbol_01.type = symbol.type;
    symbol_01.field_1.descriptor = symbol.field_1.descriptor;
    local_f8 = full_name;
    bVar1 = FileDescriptorTables::AddAliasUnderParent(this->file_tables_,pFVar4,local_58,symbol_01);
    if (!bVar1) {
      if (this->had_errors_ != false) {
        return false;
      }
      internal::LogMessage::LogMessage
                ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                 ,0xf07);
      pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_d0,"\"");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,local_f8);
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,
                          "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_d0);
      return false;
    }
    return true;
  }
  local_d0._0_8_ = (full_name->_M_dataplus)._M_p;
  cVar3 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->tables_->symbols_by_name_,(key_type *)local_d0);
  if (cVar3.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    LVar8 = LOGLEVEL_INFO;
    local_d0._8_8_ = (Descriptor *)0x0;
  }
  else {
    LVar8 = *(LogLevel *)
             ((long)cVar3.
                    super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                    ._M_cur + 0x10);
    local_d0._8_8_ =
         *(anon_union_8_8_13f84498_for_Symbol_2 *)
          ((long)cVar3.
                 super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                 ._M_cur + 0x18);
  }
  local_d0._0_4_ = LVar8;
  pFVar4 = Symbol::GetFile((Symbol *)local_d0);
  if (pFVar4 != this->file_) {
    std::operator+(&local_98,"\"",full_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_e0 = *puVar9;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar9;
      local_f0 = (ulong *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,**(ulong **)pFVar4);
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118.field_2._8_8_ = puVar7[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_118._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      local_d0._16_8_ = *psVar10;
      local_d0._24_8_ = plVar5[3];
      local_d0._0_8_ = local_d0 + 0x10;
    }
    else {
      local_d0._16_8_ = *psVar10;
      local_d0._0_8_ = (size_type *)*plVar5;
    }
    local_d0._8_8_ = *(anon_union_8_8_13f84498_for_Symbol_2 *)(plVar5 + 1);
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    AddError(this,full_name,(Message *)local_f8,NAME,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    local_40[0] = local_98.field_2._M_allocated_capacity;
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return false;
    }
    goto LAB_002e237b;
  }
  lVar6 = std::__cxx11::string::rfind((char)full_name,0x2e);
  if (lVar6 == -1) {
    std::operator+(&local_118,"\"",full_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      local_d0._16_8_ = *psVar10;
      local_d0._24_8_ = plVar5[3];
      local_d0._0_8_ = local_d0 + 0x10;
    }
    else {
      local_d0._16_8_ = *psVar10;
      local_d0._0_8_ = (size_type *)*plVar5;
    }
    local_d0._8_8_ = *(anon_union_8_8_13f84498_for_Symbol_2 *)(plVar5 + 1);
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    AddError(this,full_name,(Message *)local_f8,NAME,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    local_40[0] = local_118.field_2._M_allocated_capacity;
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      return false;
    }
    goto LAB_002e237b;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)full_name);
  puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x356813);
  psVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_98.field_2._M_allocated_capacity = *psVar10;
    local_98.field_2._8_8_ = puVar7[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar10;
    local_98._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_98._M_string_length = puVar7[1];
  *puVar7 = psVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_e0 = *puVar9;
    lStack_d8 = plVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar9;
    local_f0 = (ulong *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_78,(ulong)full_name);
  uVar11 = 0xf;
  if (local_f0 != &local_e0) {
    uVar11 = local_e0;
  }
  if (uVar11 < (ulong)(local_70 + local_e8)) {
    uVar11 = 0xf;
    if (local_78 != local_68) {
      uVar11 = local_68[0];
    }
    if (uVar11 < (ulong)(local_70 + local_e8)) goto LAB_002e21a2;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_002e21a2:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_78);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar10 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118.field_2._8_8_ = puVar7[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_118._M_string_length = puVar7[1];
  *puVar7 = psVar10;
  puVar7[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    local_d0._16_8_ = *psVar10;
    local_d0._24_8_ = plVar5[3];
    local_d0._0_8_ = local_d0 + 0x10;
  }
  else {
    local_d0._16_8_ = *psVar10;
    local_d0._0_8_ = (size_type *)*plVar5;
  }
  local_d0._8_8_ = *(anon_union_8_8_13f84498_for_Symbol_2 *)(plVar5 + 1);
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  AddError(this,full_name,(Message *)local_f8,NAME,(string *)local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40) {
    return false;
  }
LAB_002e237b:
  operator_delete(local_50[0],local_40[0] + 1);
  return false;
}

Assistant:

bool DescriptorBuilder::AddSymbol(
    const string& full_name, const void* parent, const string& name,
    const Message& proto, Symbol symbol) {
  // If the caller passed NULL for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == NULL) parent = file_;

  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        GOOGLE_LOG(DFATAL) << "\"" << full_name << "\" not previously defined in "
                       "symbols_by_name_, but was defined in "
                       "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name + "\" is already defined.");
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name.substr(dot_pos + 1) +
                 "\" is already defined in \"" +
                 full_name.substr(0, dot_pos) + "\".");
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + full_name + "\" is already defined in file \"" +
               other_file->name() + "\".");
    }
    return false;
  }
}